

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageU16 *image,char *name)

{
  unsigned_short ***pppuVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  IOException *pIVar9;
  long lVar10;
  pointer puVar11;
  long lVar12;
  ulong uVar13;
  long k;
  ulong uVar14;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> line;
  
  lVar8 = TIFFOpen(name,"w");
  if (lVar8 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_68,name,(allocator *)&line);
    std::operator+(&local_88,"Cannot store image: ",&local_68);
    gutil::IOException::IOException(pIVar9,&local_88);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar8,0x100,(int)image->width);
  TIFFSetField(lVar8,0x101,(int)image->height);
  TIFFSetField(lVar8,0x115,(short)image->depth);
  TIFFSetField(lVar8,0x102,0x10);
  TIFFSetField(lVar8,0x153,1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)image->depth * image->width * 2;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar5 = SUB164(auVar3 / auVar2,0);
  if (uVar5 < 2) {
    uVar5 = 1;
  }
  uVar4 = (uint)image->height;
  if ((int)uVar5 < (int)uVar4) {
    uVar4 = uVar5;
  }
  uVar6 = TIFFDefaultStripSize(lVar8,uVar4,SUB168(auVar3 % auVar2,0));
  TIFFSetField(lVar8,0x116,uVar6);
  TIFFSetField(lVar8,0x112,1);
  TIFFSetField(lVar8,0x11c,1);
  TIFFSetField(lVar8,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    uVar14 = 0;
    while ((long)uVar14 < image->height) {
      iVar7 = TIFFWriteScanline(lVar8,(*image->img)[uVar14],uVar14 & 0xffffffff,0);
      uVar14 = uVar14 + 1;
      if (iVar7 < 0) {
        TIFFClose(lVar8);
        pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,name,(allocator *)&line);
        std::operator+(&local_88,"Cannot write image data: ",&local_68);
        gutil::IOException::IOException(pIVar9,&local_88);
        __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
  }
  else {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&line,(long)image->depth * image->width,(allocator_type *)&local_88);
    uVar14 = 0;
    while ((long)uVar14 < image->height) {
      iVar7 = image->depth;
      if (image->depth < 1) {
        iVar7 = 0;
      }
      lVar10 = image->width;
      if (image->width < 1) {
        lVar10 = 0;
      }
      puVar11 = line.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar12 = 0; lVar12 != lVar10; lVar12 = lVar12 + 1) {
        pppuVar1 = image->img;
        for (uVar13 = 0; (uint)(iVar7 * 2) != uVar13; uVar13 = uVar13 + 2) {
          *(undefined2 *)((long)puVar11 + uVar13) =
               *(undefined2 *)
                (*(long *)(*(long *)((long)pppuVar1 + uVar13 * 4) + uVar14 * 8) + lVar12 * 2);
        }
        puVar11 = (pointer)((long)puVar11 + uVar13);
      }
      iVar7 = TIFFWriteScanline(lVar8,line.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_start,uVar14 & 0xffffffff,
                                0);
      uVar14 = uVar14 + 1;
      if (iVar7 < 0) {
        TIFFClose(lVar8);
        pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_68,name,&local_89);
        std::operator+(&local_88,"Cannot write image data: ",&local_68);
        gutil::IOException::IOException(pIVar9,&local_88);
        __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&line.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  TIFFClose(lVar8);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageU16 &image, const char *name) const
{
  saveInternal(image, name);
}